

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O3

bool __thiscall
EOPlus::Parser::GetTokenIf
          (Parser *this,Token *t,function<bool_(const_EOPlus::Token_&)> *f,uint allow)

{
  string *this_00;
  Parser_Token_Server_Base *this_01;
  pointer pcVar1;
  bool bVar2;
  undefined1 local_110 [24];
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  bool local_d8;
  bool bStack_d7;
  bool bStack_d6;
  bool bStack_d5;
  bool bStack_d4;
  undefined3 uStack_d3;
  var_type local_d0;
  int local_c8;
  variant local_c0;
  undefined1 local_80 [24];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48;
  var_type local_40;
  int local_38;
  
  Parser_Token_Server_Base::GetToken
            ((Token *)local_110,
             (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl,allow);
  t->type = local_110._0_4_;
  *(ulong *)&t->data = CONCAT44(local_110._12_4_,local_110._8_4_);
  (t->data).val_float = (double)CONCAT44(local_110._20_4_,local_110._16_4_);
  this_00 = &(t->data).val_string;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_f8);
  (t->data).val_bool = local_d8;
  (t->data).cache_val[0] = bStack_d7;
  (t->data).cache_val[1] = bStack_d6;
  (t->data).cache_val[2] = bStack_d5;
  (t->data).cache_val[3] = bStack_d4;
  *(undefined3 *)&(t->data).field_0x35 = uStack_d3;
  (t->data).type = local_d0;
  t->newlines = local_c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  if (t->type == Invalid) {
    local_80._0_4_ = Invalid;
  }
  else {
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    bVar2 = (*f->_M_invoker)((_Any_data *)f,t);
    local_80._0_4_ = t->type;
    if (!bVar2) {
      this_01 = (this->tok)._M_t.
                super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                ._M_t.
                super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
      local_80._8_4_ = (t->data).val_int;
      local_80._12_4_ = *(undefined4 *)&(t->data).field_0x4;
      local_80._16_4_ = *(undefined4 *)&(t->data).val_float;
      local_80._20_4_ = *(undefined4 *)((long)&(t->data).val_float + 4);
      pcVar1 = (t->data).val_string._M_dataplus._M_p;
      local_68._M_p = (pointer)&local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + (t->data).val_string._M_string_length);
      local_40 = (t->data).type;
      local_48._0_1_ = (t->data).val_bool;
      local_48._1_1_ = (t->data).cache_val[0];
      local_48._2_1_ = (t->data).cache_val[1];
      local_48._3_1_ = (t->data).cache_val[2];
      local_48._4_1_ = (t->data).cache_val[3];
      local_48._5_3_ = *(undefined3 *)&(t->data).field_0x35;
      local_38 = t->newlines;
      Parser_Token_Server_Base::PutBack(this_01,(Token *)local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_p != &local_58) {
        operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
      }
      util::variant::variant(&local_c0);
      local_110._0_4_ = Invalid;
      local_110._8_4_ = local_c0.val_int;
      local_110._12_4_ = local_c0._4_4_;
      local_110._16_4_ = local_c0.val_float._0_4_;
      local_110._20_4_ = local_c0.val_float._4_4_;
      local_f8._M_p = (pointer)&local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_c0.val_string._M_dataplus._M_p,
                 local_c0.val_string._M_dataplus._M_p + local_c0.val_string._M_string_length);
      local_d0 = local_c0.type;
      local_d8 = local_c0.val_bool;
      bStack_d7 = local_c0.cache_val[0];
      bStack_d6 = local_c0.cache_val[1];
      bStack_d5 = local_c0.cache_val[2];
      bStack_d4 = local_c0.cache_val[3];
      uStack_d3 = local_c0._53_3_;
      local_c8 = 0;
      t->type = local_110._0_4_;
      *(ulong *)&t->data = CONCAT44(local_110._12_4_,local_110._8_4_);
      (t->data).val_float = (double)CONCAT44(local_110._20_4_,local_110._16_4_);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_f8);
      (t->data).val_bool = local_d8;
      (t->data).cache_val[0] = bStack_d7;
      (t->data).cache_val[1] = bStack_d6;
      (t->data).cache_val[2] = bStack_d5;
      (t->data).cache_val[3] = bStack_d4;
      *(undefined3 *)&(t->data).field_0x35 = uStack_d3;
      (t->data).type = local_d0;
      t->newlines = local_c8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p != &local_e8) {
        operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.val_string._M_dataplus._M_p != &local_c0.val_string.field_2) {
        operator_delete(local_c0.val_string._M_dataplus._M_p,
                        local_c0.val_string.field_2._M_allocated_capacity + 1);
      }
      local_80._0_4_ = t->type;
    }
  }
  return local_80._0_4_ != Invalid;
}

Assistant:

bool GetTokenIf(Token& t, std::function<bool(const Token&)> f, unsigned int allow = 0xFFFFFFFF)
			{
				t = this->tok->GetToken(allow);

				if (t && !f(t))
				{
					this->tok->PutBack(t);
					t = Token();
				}

				return bool(t);
			}